

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_client::response_read
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,ptr<buffer> *resp_buf,
          error_code err,size_t bytes_transferred)

{
  uint uVar1;
  element_type *peVar2;
  pointer pcVar3;
  byte bVar4;
  uint8_t uVar5;
  bool bVar6;
  uint32_t uVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  byte *data;
  uint64_t uVar11;
  _func_int **pp_Var12;
  undefined8 uVar13;
  uint uVar14;
  ptr<resp_msg> rsp;
  uint32_t flags;
  undefined1 local_179;
  ptr<rpc_exception> except;
  buffer_serializer bs;
  element_type *local_130;
  ptr<asio_rpc_client> self;
  ptr<buffer> ctx_buf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [5];
  char *local_b0;
  undefined1 local_a8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Any_data local_80;
  _Manager_type local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar14 = err._M_value;
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if (uVar14 == 0) {
    buffer_serializer::buffer_serializer(&bs,resp_buf,LITTLE);
    data = buffer::data_begin((resp_buf->
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             );
    uVar7 = crc32_8(data,0x1f,0);
    buffer_serializer::pos(&bs,0x1f);
    uVar11 = buffer_serializer::get_u64(&bs);
    flags = (uint32_t)(uVar11 >> 0x20);
    if (uVar7 == (uint32_t)uVar11) {
      buffer_serializer::pos(&bs,1);
      bVar4 = buffer_serializer::get_u8(&bs);
      iVar8 = buffer_serializer::get_i32(&bs);
      iVar9 = buffer_serializer::get_i32(&bs);
      uVar11 = buffer_serializer::get_u64(&bs);
      pp_Var12 = (_func_int **)buffer_serializer::get_u64(&bs);
      uVar5 = buffer_serializer::get_u8(&bs);
      iVar10 = buffer_serializer::get_i32(&bs);
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb0);
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b2198;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = (int)uVar11;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = (int)(uVar11 >> 0x20);
      *(uint *)&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[2]._vptr__Sp_counted_base = (uint)bVar4;
      *(int32_t *)
       ((long)&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi[2]._vptr__Sp_counted_base + 4) = iVar8;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = iVar9;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR__resp_msg_005b21e8;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _vptr__Sp_counted_base = pp_Var12;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _M_weak_count = 0;
      *(bool *)&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[4]._vptr__Sp_counted_base = uVar5 == '\x01';
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
      _M_use_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
      _M_weak_count = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[10].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[10].
      _M_use_count = 0;
      if ((((flags & 1) == 0) &&
          ((this->impl_->my_opt_).read_resp_meta_.super__Function_base._M_manager !=
           (_Manager_type)0x0)) && ((this->impl_->my_opt_).invoke_resp_cb_on_empty_meta_ == true)) {
        ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_108[0]._M_local_buf[0] = '\0';
        ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_108;
        bVar6 = handle_custom_resp_meta(this,req,&rsp,when_done,(string *)&ctx_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            local_108) {
          operator_delete(ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
        if (!bVar6) goto joined_r0x00196d1f;
      }
      if (iVar10 == 0) {
        asio::
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::cancel(&this->operation_timer_);
        set_busy_flag(this,false);
        ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00196da8;
        (*when_done->_M_invoker)
                  ((_Any_data *)when_done,&rsp,(shared_ptr<nuraft::rpc_exception> *)&ctx_buf);
      }
      else {
        buffer::alloc((buffer *)&ctx_buf,(size_t)(long)iVar10);
        bVar6 = this->ssl_enabled_;
        except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             buffer::data(ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        local_a8._0_8_ = ctx_read;
        local_a8._8_8_ = 0;
        except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar10;
        std::
        _Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>>
        ::
        _Tuple_impl<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                  ((_Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>>
                    *)(local_a8 + 0x10),&self,req,&rsp,when_done,&ctx_buf,&flags,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        aa::
        read<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>
                  (bVar6,&this->ssl_socket_,&this->socket_,(mutable_buffers_1 *)&except,
                   (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>
                    *)local_a8);
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        }
        if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
        }
        if (local_70 != (_Manager_type)0x0) {
          (*local_70)(&local_80,&local_80,__destroy_functor);
        }
        if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
        }
      }
      if (ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
joined_r0x00196d1f:
      if (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return;
    }
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b0 = "CRC mismatch in response from peer %d, %s:%s, local calculation %x, from buffer %x";
    snprintf((char *)&ctx_buf,100,
             "CRC mismatch in response from peer %d, %s:%s, local calculation %x, from buffer %x",
             (ulong)(uint)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->super_msg_base).dst_,(this->host_)._M_dataplus._M_p,
             (this->port_)._M_dataplus._M_p,(ulong)uVar7,uVar11);
    except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_130 = (element_type *)&ctx_buf;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&except,(allocator<nuraft::rpc_exception> *)&local_179
               ,(char **)&local_130,req);
    req = (ptr<req_msg> *)&ctx_buf;
    if ((when_done->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*when_done->_M_invoker)((_Any_data *)when_done,&rsp,&except);
      if (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto joined_r0x00196d1f;
    }
  }
  else {
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b0 = "failed to read response to peer %d, %s:%s, error %d, %s";
    uVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_msg_base).dst_;
    peVar2 = (element_type *)(this->host_)._M_dataplus._M_p;
    pcVar3 = (this->port_)._M_dataplus._M_p;
    (**(code **)(*(long *)err._M_cat + 0x20))(&bs,err._M_cat,(ulong)uVar14);
    snprintf((char *)&ctx_buf,100,local_b0,(ulong)uVar1,peVar2,pcVar3,(ulong)uVar14,bs._0_8_);
    except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_130 = (element_type *)&ctx_buf;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&except,(allocator<nuraft::rpc_exception> *)&flags,
               (char **)&local_130,req);
    if ((size_t *)bs._0_8_ != &bs.pos_) {
      operator_delete((void *)bs._0_8_);
    }
    if ((when_done->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*when_done->_M_invoker)((_Any_data *)when_done,&rsp,&except);
      if (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto joined_r0x00196d1f;
    }
    std::__throw_bad_function_call();
    req = (ptr<req_msg> *)peVar2;
  }
  std::__throw_bad_function_call();
LAB_00196da8:
  uVar13 = std::__throw_bad_function_call();
  if (ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)req) {
    operator_delete(ctx_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Unwind_Resume(uVar13);
}

Assistant:

void response_read(ptr<req_msg>& req,
                       rpc_handler& when_done,
                       ptr<buffer>& resp_buf,
                       std::error_code err,
                       size_t bytes_transferred)
    {
        ptr<asio_rpc_client> self(this->shared_from_this());
        if (err) {
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "failed to read response to peer %d, %s:%s, "
                             "error %d, %s" )
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return;
        }

        buffer_serializer bs(resp_buf);
        uint32_t crc_local = crc32_8( resp_buf->data_begin(),
                                      RPC_RESP_HEADER_SIZE - CRC_FLAGS_LEN,
                                      0 );
        bs.pos(RPC_RESP_HEADER_SIZE - CRC_FLAGS_LEN);
        uint64_t flags_and_crc = bs.get_u64();
        uint32_t crc_buf = flags_and_crc & (uint32_t)0xffffffff;
        uint32_t flags = (flags_and_crc >> 32);

        if (crc_local != crc_buf) {
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "CRC mismatch in response from peer %d, %s:%s, "
                             "local calculation %x, from buffer %x")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), crc_local, crc_buf ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return;
        }

        bs.pos(1);
        byte msg_type_val = bs.get_u8();
        int32 src = bs.get_i32();
        int32 dst = bs.get_i32();
        ulong term = bs.get_u64();
        ulong nxt_idx = bs.get_u64();
        byte accepted_val = bs.get_u8();
        int32 carried_data_size = bs.get_i32();
        ptr<resp_msg> rsp
            ( cs_new<resp_msg>
              ( term, (msg_type)msg_type_val, src, dst,
                nxt_idx, accepted_val == 1 ) );

        if ( !(flags & INCLUDE_META) &&
             impl_->get_options().read_resp_meta_ &&
             impl_->get_options().invoke_resp_cb_on_empty_meta_ ) {
            // If callback is given, but meta is empty, and
            // the "always invoke" flag is set, invoke it.
            bool meta_ok = handle_custom_resp_meta
                           ( req, rsp, when_done, std::string() );
            if (!meta_ok) return;
        }

        if (carried_data_size) {
            ptr<buffer> ctx_buf = buffer::alloc(carried_data_size);
            aa::read( ssl_enabled_, ssl_socket_, socket_,
                      asio::buffer(ctx_buf->data(), carried_data_size),
                      std::bind( &asio_rpc_client::ctx_read,
                                 self,
                                 req,
                                 rsp,
                                 when_done,
                                 ctx_buf,
                                 flags,
                                 std::placeholders::_1,
                                 std::placeholders::_2 ) );
        } else {
            operation_timer_.cancel();
            set_busy_flag(false);
            ptr<rpc_exception> except;
            when_done(rsp, except);
        }
    }